

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O3

void __thiscall
AGC::work(AGC *this,
         shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *qout)

{
  SamplePublisher *this_00;
  int __fd;
  size_type __new_size;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_30;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_28;
  
  __fd = (int)(qin->
              super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_38);
  if (local_38 == (undefined1  [8])0x0) {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,__fd);
  }
  else {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               local_40);
    __new_size = (long)*(pointer *)((long)local_38 + 8) - *(long *)local_38 >> 3;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_40,
               __new_size);
    work(this,__new_size,*(complex<float> **)local_38,*(complex<float> **)local_40);
    local_28._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_38;
    local_38 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,&local_28);
    if (local_28._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_28,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_28._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_28._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    this_00 = (this->samplePublisher_)._M_t.
              super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
              super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
              super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    if (this_00 != (SamplePublisher *)0x0) {
      SamplePublisher::publish(this_00,(Samples *)local_40);
    }
    local_30._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_40;
    local_40 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,&local_30);
    if (local_30._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_30,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_30._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_30._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    if (local_40 != (undefined1  [8])0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_40,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_40);
    }
  }
  if (local_38 != (undefined1  [8])0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)local_38,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_38);
  }
  return;
}

Assistant:

void AGC::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  auto nsamples = input->size();
  output->resize(nsamples);

  // Do actual work
  auto ci = input->data();
  auto co = output->data();
  work(nsamples, ci, co);

  // Return input buffer
  qin->pushRead(std::move(input));

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}